

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall FIX::Message::Message(Message *this,string *string,bool validate)

{
  message_order local_40;
  byte local_19;
  string *psStack_18;
  bool validate_local;
  string *string_local;
  Message *this_local;
  
  local_19 = validate;
  psStack_18 = string;
  string_local = (string *)this;
  message_order::message_order(&local_40,normal);
  FieldMap::FieldMap(&this->super_FieldMap,&local_40);
  message_order::~message_order(&local_40);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_00330260;
  Header::Header(&this->m_header);
  Trailer::Trailer(&this->m_trailer);
  this->m_validStructure = true;
  this->m_tag = 0;
  setString(this,psStack_18,(bool)(local_19 & 1));
  return;
}

Assistant:

EXCEPT(InvalidMessage)
    : m_validStructure(true),
      m_tag(0) {
  setString(string, validate);
}